

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

int sys_trim(mstate m,size_t pad)

{
  int iVar1;
  ulong uVar2;
  msegmentptr pmVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  msegmentptr sp;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  mstate pmVar8;
  size_t extraout_RDX_01;
  ulong __len;
  mstate m_00;
  bool bVar9;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar7 = mparams.granularity;
  if ((mstate)0xffffffffffffff7f < m) {
    return 0;
  }
  if (_gm_.top == (mchunkptr)0x0) {
    return 0;
  }
  m_00 = (mstate)_gm_.top;
  if (_gm_.topsize <= m->smallbins + 1) goto LAB_001063ff;
  __len = 0;
  uVar2 = (((_gm_.topsize - (long)m) + mparams.granularity) - 0x51) / mparams.granularity;
  pmVar3 = segment_holding((mstate)_gm_.top,(char *)pad);
  if ((pmVar3->sflags & 8) != 0) goto LAB_00106401;
  __len = (uVar2 - 1) * sVar7;
  if ((pmVar3->sflags & 1) == 0) {
    uVar2 = 0x8000000000000000 - sVar7;
    if (__len < 0x7fffffffffffffff) {
      uVar2 = __len;
    }
    LOCK();
    UNLOCK();
    bVar9 = malloc_global_mutex != 0;
    malloc_global_mutex = 1;
    if (bVar9) {
      spin_acquire_lock(&malloc_global_mutex);
    }
    m_00 = (mstate)0x0;
    pcVar4 = (char *)sbrk(0);
    sVar7 = extraout_RDX;
    __len = 0;
    if (pcVar4 == pmVar3->base + pmVar3->size) {
      pvVar5 = sbrk(-uVar2);
      m_00 = (mstate)0x0;
      pcVar6 = (char *)sbrk(0);
      __len = (long)pcVar4 - (long)pcVar6;
      if (pcVar4 < pcVar6 || (long)pcVar4 - (long)pcVar6 == 0) {
        __len = 0;
      }
      sVar7 = extraout_RDX_00;
      if (pvVar5 == (void *)0xffffffffffffffff) {
        __len = 0;
      }
    }
    malloc_global_mutex = 0;
LAB_00106393:
    if (__len != 0) {
      pmVar3->size = pmVar3->size - __len;
      _gm_.footprint = _gm_.footprint - __len;
      m_00 = (mstate)_gm_.top;
      init_top((mstate)_gm_.top,(mchunkptr)(_gm_.topsize - __len),sVar7);
      goto LAB_00106401;
    }
  }
  else {
    uVar2 = pmVar3->size;
    if (__len <= uVar2) {
      m_00 = (mstate)pmVar3->base;
      pmVar8 = (mstate)&_gm_.seg;
      do {
        if (m_00 <= pmVar8 && pmVar8 < (mstate)((long)m_00->smallbins + (uVar2 - 0x48)))
        goto LAB_001063ff;
        pmVar8 = (mstate)pmVar8->topsize;
      } while (pmVar8 != (mstate)0x0);
      m_00 = (mstate)((long)m_00 + (uVar2 - __len));
      iVar1 = munmap(m_00,__len);
      sVar7 = extraout_RDX_01;
      if (iVar1 == 0) goto LAB_00106393;
    }
  }
LAB_001063ff:
  __len = 0;
LAB_00106401:
  sVar7 = release_unused_segments(m_00);
  if (sVar7 + __len == 0) {
    iVar1 = 0;
    if (_gm_.trim_check < _gm_.topsize) {
      _gm_.trim_check = 0xffffffffffffffff;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}